

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void add_module_headers(path *dir,
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *headers)

{
  bool bVar1;
  type tVar2;
  file_type fVar3;
  pointer this;
  path *this_00;
  string *__x;
  file_status local_3c [2];
  recursive_directory_iterator local_28;
  recursive_directory_iterator last;
  recursive_directory_iterator it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *headers_local;
  path *dir_local;
  
  bVar1 = boost::filesystem::exists(dir);
  if (bVar1) {
    boost::filesystem::recursive_directory_iterator::recursive_directory_iterator(&last,dir);
    boost::filesystem::recursive_directory_iterator::recursive_directory_iterator(&local_28);
    while (tVar2 = boost::iterators::operator!=
                             ((iterator_facade<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                               *)&last,(iterator_facade<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                                        *)&local_28), tVar2) {
      boost::iterators::detail::
      iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
      ::operator->((iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                    *)&last);
      boost::filesystem::directory_entry::status((directory_entry *)local_3c);
      fVar3 = boost::filesystem::file_status::type(local_3c);
      if (fVar3 != directory_file) {
        this = boost::iterators::detail::
               iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
               ::operator->((iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                             *)&last);
        this_00 = boost::filesystem::directory_entry::path(this);
        __x = boost::filesystem::path::generic_string_abi_cxx11_(this_00);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(headers,__x);
      }
      boost::iterators::detail::
      iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
      ::operator++((iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                    *)&last);
    }
    boost::filesystem::recursive_directory_iterator::~recursive_directory_iterator(&local_28);
    boost::filesystem::recursive_directory_iterator::~recursive_directory_iterator(&last);
  }
  return;
}

Assistant:

static void add_module_headers( fs::path const & dir, std::set<std::string> & headers )
{
    if( fs::exists( dir ) )
    {
        fs::recursive_directory_iterator it( dir ), last;

        for( ; it != last; ++it )
        {
            if( it->status().type() == fs::directory_file )
            {
                continue;
            }

            headers.insert( it->path().generic_string() );
        }
    }
}